

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O0

FP3 * __thiscall BaseFixture::urandFP3(BaseFixture *this,FP3 a,FP3 b)

{
  BaseFixture *in_RSI;
  Vector3<double> *in_RDI;
  FP FVar1;
  FP3 *result;
  undefined1 *b_00;
  FP3 **a_00;
  
  a_00 = &result;
  b_00 = &stack0x00000008;
  pica::Vector3<double>::Vector3(in_RDI);
  FVar1 = urand(in_RSI,(FP)a_00,(FP)b_00);
  in_RDI->x = FVar1;
  FVar1 = urand(in_RSI,(FP)a_00,(FP)b_00);
  in_RDI->y = FVar1;
  FVar1 = urand(in_RSI,(FP)a_00,(FP)b_00);
  in_RDI->z = FVar1;
  return in_RDI;
}

Assistant:

FP3 BaseFixture::urandFP3(FP3 a, FP3 b) {
    FP3 result;
    result.x = urand(a.x, b.x);
    result.y = urand(a.y, b.y);
    result.z = urand(a.z, b.z);
    return result;
}